

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noui.cpp
# Opt level: O1

bool noui_ThreadSafeQuestion(bilingual_str *param_1,string *message,string *caption,uint style)

{
  pointer pcVar1;
  long in_FS_OFFSET;
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (message->_M_dataplus)._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + message->_M_string_length);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_90,local_88 + (long)local_90);
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_90,local_88 + (long)local_90);
  noui_ThreadSafeMessageBox((bilingual_str *)local_70,caption,style);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool noui_ThreadSafeQuestion(const bilingual_str& /* ignored interactive message */, const std::string& message, const std::string& caption, unsigned int style)
{
    return noui_ThreadSafeMessageBox(Untranslated(message), caption, style);
}